

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

void __thiscall front::syntax::SyntaxAnalyze::gm_assign_stmt(SyntaxAnalyze *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 this_00;
  undefined8 this_01;
  byte *pbVar3;
  RightVal rightValue;
  undefined1 local_108 [24];
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  byte local_a8 [8];
  undefined1 local_a0 [32];
  byte local_80 [8];
  RightVal local_78;
  RightVal local_50;
  
  local_f0.
  super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first._M_storage
       = (_Uninitialized<int,_true>)0;
  local_f0.
  super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0;
  gm_l_val((SyntaxAnalyze *)local_108,(ValueMode)this);
  this_00 = local_108._8_8_;
  uVar1 = local_108._0_8_;
  local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108._0_8_ = (int *)0x0;
  match_one_word(this,ASSIGN);
  gm_exp((SyntaxAnalyze *)local_108);
  this_01 = local_108._8_8_;
  uVar2 = local_108._0_8_;
  local_108._8_8_ = 0;
  local_108._0_8_ = 0;
  match_one_word(this,SEMICN);
  if (*(int *)uVar2 == 0) {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr
      [local_f0.
       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
              ((anon_class_1_0_00000001 *)local_108,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_108 + 0x18));
    local_f0.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first.
    _M_storage = (_Uninitialized<int,_true>)*(int *)(uVar2 + 8);
    local_f0.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0;
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_108 + 0x18));
  }
  else {
    std::variant<int,int,std::__cxx11::string>::operator=
              ((variant<int,int,std::__cxx11::string> *)(local_108 + 0x18),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar2 + 0x10));
  }
  if (*(int *)(uVar1 + 4) == 6) {
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,*(long *)(uVar1 + 0x10),
               *(long *)(uVar1 + 0x18) + *(long *)(uVar1 + 0x10));
    local_80[0] = 1;
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_50,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_108 + 0x18));
    irGenerator::irGenerator::ir_store(&this->irGenerator,(LeftVal *)local_a0,&local_50);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr
      [local_50.
       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
              ((anon_class_1_0_00000001 *)local_108,&local_50);
    local_50.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_80[0]]._M_data)
              ((anon_class_1_0_00000001 *)local_108,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a0);
    pbVar3 = local_80;
  }
  else {
    local_c8._0_8_ = (long)&local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,*(long *)(uVar1 + 0x10),
               *(long *)(uVar1 + 0x18) + *(long *)(uVar1 + 0x10));
    local_a8[0] = 1;
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_78,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_108 + 0x18));
    irGenerator::irGenerator::ir_assign(&this->irGenerator,(LeftVal *)&local_c8._M_first,&local_78);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr
      [local_78.
       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
              ((anon_class_1_0_00000001 *)local_108,&local_78);
    local_78.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_a8[0]]._M_data)
              ((anon_class_1_0_00000001 *)local_108,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_c8._M_first);
    pbVar3 = local_a8;
  }
  *pbVar3 = 0xff;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_f0.
     super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
            ((anon_class_1_0_00000001 *)local_108,
             (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_108 + 0x18));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_assign_stmt() {
  SharedExNdPtr lVal;
  SharedExNdPtr rVal;
  RightVal rightValue;

  lVal = gm_l_val(ValueMode::left);
  match_one_word(Token::ASSIGN);
  rVal = gm_exp();
  match_one_word(Token::SEMICN);

  if (rVal->_type == NodeType::CNS) {
    rightValue.emplace<0>(rVal->_value);
  } else {
    rightValue = rVal->_name;
  }
  if (lVal->_operation == OperationType::PTR) {
    irGenerator.ir_store(lVal->_name, rightValue);
  } else {
    irGenerator.ir_assign(lVal->_name, rightValue);
  }
}